

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

Unreachable * __thiscall MixedArena::alloc<wasm::Unreachable>(MixedArena *this)

{
  Unreachable *pUVar1;
  
  pUVar1 = (Unreachable *)allocSpace(this,0x10,8);
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)23>).super_Expression._id = UnreachableId;
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)23>).super_Expression.type.id = 1;
  return pUVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }